

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcolu.c
# Opt level: O0

int ffppru(fitsfile *fptr,long group,LONGLONG firstelem,LONGLONG nelem,int *status)

{
  int iVar1;
  int *in_R8;
  long row;
  int *in_stack_000001e0;
  LONGLONG in_stack_000001e8;
  LONGLONG in_stack_000001f0;
  LONGLONG in_stack_000001f8;
  int in_stack_00000204;
  fitsfile *in_stack_00000208;
  fitsfile *in_stack_ffffffffffffffb8;
  int local_4;
  
  iVar1 = fits_is_compressed_image(in_stack_ffffffffffffffb8,(int *)0x222e4c);
  if (iVar1 == 0) {
    ffpclu(in_stack_00000208,in_stack_00000204,in_stack_000001f8,in_stack_000001f0,in_stack_000001e8
           ,in_stack_000001e0);
    local_4 = *in_R8;
  }
  else {
    ffpmsg((char *)0x222e5d);
    *in_R8 = 0x19d;
    local_4 = 0x19d;
  }
  return local_4;
}

Assistant:

int ffppru( fitsfile *fptr,  /* I - FITS file pointer                       */
            long  group,      /* I - group to write(1 = 1st group)          */
            LONGLONG  firstelem,  /* I - first vector element to write(1 = 1st) */
            LONGLONG  nelem,      /* I - number of values to write              */
            int  *status)     /* IO - error status                          */
/*
  Write null values to the primary array.

*/
{
    long row;

    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */

        ffpmsg("writing to compressed image is not supported");

        return(*status = DATA_COMPRESSION_ERR);
    }

    row=maxvalue(1,group);

    ffpclu(fptr, 2, row, firstelem, nelem, status);
    return(*status);
}